

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SMatrix<long,_2,_3> * __thiscall
gmath::SMatrix<long,_2,_3>::operator=(SMatrix<long,_2,_3> *this,long s)

{
  int i;
  int k;
  long s_local;
  SMatrix<long,_2,_3> *this_local;
  
  for (k = 0; k < 2; k = k + 1) {
    for (i = 0; i < 3; i = i + 1) {
      this->v[k][i] = s;
    }
  }
  return this;
}

Assistant:

SMatrix<T, nrows, ncols> &operator=(T s)
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]=s;
        }

      return *this;
    }